

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O2

int Kit_GraphToGia(Gia_Man_t *pMan,Kit_Graph_t *pGraph,Vec_Int_t *vLeaves,int fHash)

{
  Kit_Node_t *pKVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = 8;
  lVar5 = 0;
  do {
    if (pGraph->nLeaves <= lVar5) {
      iVar2 = Kit_GraphToGiaInternal(pMan,pGraph,fHash);
      return iVar2;
    }
    pKVar1 = pGraph->pNodes;
    if (vLeaves == (Vec_Int_t *)0x0) {
      if ((long)pMan->vCis->nSize - (long)pMan->nRegs <= lVar5) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      iVar2 = Vec_IntEntry(pMan->vCis,(int)lVar5);
      pGVar3 = Gia_ManObj(pMan,iVar2);
      iVar2 = Gia_ObjId(pMan,(Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe));
      if (iVar2 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      iVar2 = ((uint)pGVar3 & 1) + iVar2 * 2;
    }
    else {
      iVar2 = Vec_IntEntry(vLeaves,(int)lVar5);
    }
    *(int *)(&(pKVar1->eEdge0).field_0x0 + lVar4) = iVar2;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

int Kit_GraphToGia( Gia_Man_t * pMan, Kit_Graph_t * pGraph, Vec_Int_t * vLeaves, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->iFunc = vLeaves ? Vec_IntEntry(vLeaves, i) : Gia_Obj2Lit(pMan, Gia_ManPi(pMan, i));
    // perform strashing
    return Kit_GraphToGiaInternal( pMan, pGraph, fHash );
}